

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md.c
# Opt level: O0

int mbedtls_md_clone(mbedtls_md_context_t *dst,mbedtls_md_context_t *src)

{
  mbedtls_md_context_t *src_local;
  mbedtls_md_context_t *dst_local;
  
  if ((((dst == (mbedtls_md_context_t *)0x0) || (dst->md_info == (mbedtls_md_info_t *)0x0)) ||
      (src == (mbedtls_md_context_t *)0x0)) ||
     ((src->md_info == (mbedtls_md_info_t *)0x0 || (dst->md_info != src->md_info)))) {
    dst_local._4_4_ = -0x5100;
  }
  else {
    (*dst->md_info->clone_func)(dst->md_ctx,src->md_ctx);
    dst_local._4_4_ = 0;
  }
  return dst_local._4_4_;
}

Assistant:

int mbedtls_md_clone( mbedtls_md_context_t *dst,
                      const mbedtls_md_context_t *src )
{
    if( dst == NULL || dst->md_info == NULL ||
        src == NULL || src->md_info == NULL ||
        dst->md_info != src->md_info )
    {
        return( MBEDTLS_ERR_MD_BAD_INPUT_DATA );
    }

    dst->md_info->clone_func( dst->md_ctx, src->md_ctx );

    return( 0 );
}